

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Expr::set_parent(Expr *this)

{
  Var *pVVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Generator *pGVar5;
  Generator *pGVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Generator *pGVar7;
  undefined4 extraout_var_05;
  Generator *pGVar4;
  undefined4 extraout_var_00;
  
  pVVar1 = this->right;
  iVar2 = (*(this->left->super_IRNode)._vptr_IRNode[0xd])();
  pGVar4 = (Generator *)CONCAT44(extraout_var,iVar2);
  pGVar7 = pGVar4;
  if (pVVar1 != (Var *)0x0) {
    iVar2 = (*(this->right->super_IRNode)._vptr_IRNode[0xd])();
    pGVar5 = (Generator *)CONCAT44(extraout_var_00,iVar2);
    pGVar6 = Const::const_gen();
    pGVar7 = pGVar5;
    if ((pGVar4 != pGVar6) &&
       (pGVar6 = Const::const_gen(), pGVar7 = pGVar4, pGVar5 != (Generator *)0x0 && pGVar5 != pGVar6
       )) {
      if (pGVar4 == pGVar5) {
        iVar2 = (*(this->left->super_IRNode)._vptr_IRNode[0xd])();
        pGVar7 = (Generator *)CONCAT44(extraout_var_05,iVar2);
      }
      else {
        iVar2 = (*(pGVar5->super_IRNode)._vptr_IRNode[4])(pGVar5);
        if ((pGVar4 != (Generator *)CONCAT44(extraout_var_01,iVar2)) ||
           (this->right->type_ != PortIO)) {
          iVar2 = (*(pGVar4->super_IRNode)._vptr_IRNode[4])(pGVar4);
          iVar3 = (*(pGVar5->super_IRNode)._vptr_IRNode[4])(pGVar5);
          pGVar7 = pGVar5;
          if ((CONCAT44(extraout_var_02,iVar2) == CONCAT44(extraout_var_03,iVar3)) &&
             ((this->left->type_ == PortIO && (this->right->type_ == PortIO)))) {
            iVar2 = (*(pGVar4->super_IRNode)._vptr_IRNode[4])(pGVar4);
            if (CONCAT44(extraout_var_04,iVar2) == 0) {
              pGVar7 = (Generator *)0x0;
            }
            else {
              pGVar7 = (Generator *)
                       __dynamic_cast(CONCAT44(extraout_var_04,iVar2),&IRNode::typeinfo,
                                      &Generator::typeinfo,0);
            }
          }
        }
      }
    }
  }
  (this->super_Var).generator_ = pGVar7;
  return;
}

Assistant:

void Expr::set_parent() {
    // compute the right parent for the expr
    // it can only go up
    if (!right) {
        generator_ = left->generator();
    } else {
        auto *left_gen = left->generator();
        auto *right_gen = right->generator();
        if (left_gen == Const::const_gen()) {
            generator_ = right_gen;
        } else if (right_gen == Const::const_gen() || !right_gen) {
            generator_ = left_gen;
        } else if (left_gen == right_gen) {
            generator_ = left->generator();
        } else {
            // choose the higher/lower one based on the var type
            if (left_gen == right_gen->parent() && right->type() == VarType::PortIO) {
                generator_ = left_gen;
            } else if (left_gen->parent() == right_gen->parent() &&
                       left->type() == VarType::PortIO && right->type() == VarType::PortIO) {
                generator_ = dynamic_cast<Generator *>(left_gen->parent());
            } else {
                generator_ = right_gen;
            }
        }
    }
}